

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

Info * __thiscall Ptex::v2_2::PtexReader::getInfo(Info *__return_storage_ptr__,PtexReader *this)

{
  PtexReader *this_local;
  
  __return_storage_ptr__->meshType = (this->_header).meshtype;
  __return_storage_ptr__->dataType = (this->_header).datatype;
  __return_storage_ptr__->uBorderMode = (uint)(this->_extheader).ubordermode;
  __return_storage_ptr__->vBorderMode = (uint)(this->_extheader).vbordermode;
  __return_storage_ptr__->edgeFilterMode = (uint)(this->_extheader).edgefiltermode;
  __return_storage_ptr__->alphaChannel = (this->_header).alphachan;
  __return_storage_ptr__->numChannels = (uint)(this->_header).nchannels;
  __return_storage_ptr__->numFaces = (this->_header).nfaces;
  return __return_storage_ptr__;
}

Assistant:

virtual Info getInfo() {
        Info info;
        info.meshType = MeshType(_header.meshtype);
        info.dataType = DataType(_header.datatype);
        info.uBorderMode = BorderMode(_extheader.ubordermode);
        info.vBorderMode = BorderMode(_extheader.vbordermode);
        info.edgeFilterMode = EdgeFilterMode(_extheader.edgefiltermode);
        info.alphaChannel = _header.alphachan;
        info.numChannels = _header.nchannels;
        info.numFaces = _header.nfaces;
        return info;
    }